

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_substring_reallocationFailed_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_80;
  AString *pAStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.buffer = (char *)0x0;
  string.size = 0x10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14f309;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"xxxx01234567xxxx",0x11);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  uStack_50 = 0x14f34f;
  pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
  if (pAVar2 != (AString *)0x0) {
    iVar1 = 0x9cf;
LAB_0014f632:
    pcVar6 = "(void*) substring";
    pcVar5 = "(void*) substring == NULL";
    expr = "Assertion \'_ck_x == NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    ppcVar4 = (char **)&uStack_50;
    goto LAB_0014f739;
  }
  uStack_50 = 0x14f369;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9cf);
  if (string.capacity != 0x10) {
    pcStack_60 = "(16)";
    pcVar5 = "(string).capacity == (16)";
    pcVar6 = "(string).capacity";
    pAVar2 = (AString *)string.capacity;
LAB_0014f5fd:
    iVar1 = 0x9d0;
LAB_0014f731:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = (char *)0x10;
    ppcVar4 = &pcStack_60;
    goto LAB_0014f739;
  }
  uStack_50 = 0x14f389;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9d0);
  if (string.buffer == (char *)0x0) {
    iVar1 = 0x9d0;
LAB_0014f69d:
    uStack_50 = 0;
    local_58 = (char *)0x0;
    pcStack_60 = (char *)0x14f6a4;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer");
  }
  uStack_50 = 0x14f3a6;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9d0);
  pcVar7 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pAVar2 = (AString *)0x1690ff;
    pcVar7 = "(null)";
LAB_0014f591:
    iVar1 = 0x9d0;
  }
  else {
    uStack_50 = 0x14f3c6;
    iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
    if (iVar1 != 0) {
      pAVar2 = (AString *)0x15d4c3;
      goto LAB_0014f591;
    }
    uStack_50 = 0x14f3df;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d0);
    if (string.size != 0x10) {
      pcStack_60 = "strlen(\"xxxx01234567xxxx\")";
      pcVar5 = "(string).size == strlen(\"xxxx01234567xxxx\")";
      pcVar6 = "(string).size";
      pAVar2 = (AString *)string.size;
      goto LAB_0014f5fd;
    }
    uStack_50 = 0x14f3ff;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d0);
    private_ACUtilsTest_AString_reallocFailCounter = 1;
    private_ACUtilsTest_AString_reallocFail = 1;
    uStack_50 = 0x14f422;
    pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
    if (pAVar2 != (AString *)0x0) {
      iVar1 = 0x9d3;
      goto LAB_0014f632;
    }
    uStack_50 = 0x14f43c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d3);
    if (string.capacity != 0x10) {
      pcStack_60 = "(16)";
      pcVar5 = "(string).capacity == (16)";
      pcVar6 = "(string).capacity";
      pAVar2 = (AString *)string.capacity;
LAB_0014f72c:
      iVar1 = 0x9d4;
      goto LAB_0014f731;
    }
    uStack_50 = 0x14f45c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d4);
    if (string.buffer == (char *)0x0) {
      iVar1 = 0x9d4;
      goto LAB_0014f69d;
    }
    uStack_50 = 0x14f479;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d4);
    pcVar7 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar7 = "(null)";
      pAVar2 = (AString *)0x1690ff;
    }
    else {
      uStack_50 = 0x14f496;
      iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x14f4af;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9d4);
        if (string.size == 0x10) {
          uStack_50 = 0x14f4cf;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d4);
          uStack_50 = 0x14f4d8;
          (*string.deallocator)(string.buffer);
          return;
        }
        pcStack_60 = "strlen(\"xxxx01234567xxxx\")";
        pcVar5 = "(string).size == strlen(\"xxxx01234567xxxx\")";
        pcVar6 = "(string).size";
        pAVar2 = (AString *)string.size;
        goto LAB_0014f72c;
      }
      pAVar2 = (AString *)0x15d4c3;
    }
    iVar1 = 0x9d4;
  }
  pcVar6 = "(string).buffer";
  pcVar5 = "(string).buffer == (\"xxxx01234567xxxx\")";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  pcStack_60 = "xxxx01234567xxxx";
  pcStack_68 = "\"";
  pcStack_70 = "(\"xxxx01234567xxxx\")";
  ppcVar4 = &pcStack_80;
  pcStack_80 = pcVar7;
  pAStack_78 = pAVar2;
LAB_0014f739:
  uStack_50 = 0;
  *(AString **)((long)ppcVar4 + -8) = pAVar2;
  *(code **)((long)ppcVar4 + -0x10) = test_AString_substring_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_reallocationFailed)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_setReallocFail(true, 1);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_destructTestString(string);
}